

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetRepeatedEnumValueInternal
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          int value)

{
  uint32 uVar1;
  int local_2c;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar1 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    ExtensionSet::SetRepeatedEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
               *(int *)(field + 0x38),index,value);
    return;
  }
  local_2c = value;
  uVar1 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  RepeatedField<int>::Set
            ((RepeatedField<int> *)
             ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),index,&local_2c)
  ;
  return;
}

Assistant:

void GeneratedMessageReflection::SetRepeatedEnumValueInternal(
    Message* message,
    const FieldDescriptor* field, int index,
    int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedEnum(
      field->number(), index, value);
  } else {
    SetRepeatedField<int>(message, field, index, value);
  }
}